

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O3

void sm3_speed(void *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  timeval tv_1;
  uint8_t digest [32];
  uchar msg [8192];
  timeval local_2068;
  uint8_t local_2058 [32];
  timeval local_2038 [512];
  
  lVar4 = 100000;
  if (*(long *)((long)p + 8) < 0x4e21) {
    lVar4 = *(long *)((long)p + 8) * 5;
  }
  uVar1 = rdtsc();
  gettimeofday(local_2038,(__timezone_ptr_t)0x0);
  if (0 < lVar4) {
    lVar3 = lVar4;
    do {
      SM3_once((uint8_t *)local_2038,0x2000,local_2058);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  uVar2 = rdtsc();
  gettimeofday(&local_2068,(__timezone_ptr_t)0x0);
  dVar5 = (double)((local_2068.tv_sec - local_2038[0].tv_sec) * 1000000 +
                  (local_2068.tv_usec - local_2038[0].tv_usec));
  dVar6 = (double)(lVar4 << 0xd) / dVar5;
  lVar3 = CONCAT44(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) -
                   (uint)((uint)uVar2 < (uint)uVar1),(uint)uVar2 - (uint)uVar1);
  printf("average cycles per block : %ld \n",lVar3 / (lVar4 << 7),lVar3 % (lVar4 << 7));
  puts("block(B) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) ");
  printf("   %ld     \t  %.4f  \t    %.4f   \t   %.4f \n\n",dVar5 / 1000.0,dVar6,
         (dVar6 * 8.0) / 1000.0,0x2000);
  return;
}

Assistant:

static void sm3_speed(void *p)
{
    int64_t N;
    double usec;
    double avg_speed_MB, avg_speed_Gb;
    const int64_t block = 8192;

    uint8_t digest[32];
    unsigned char msg[8192];

    TEST_ARGS *args = (TEST_ARGS*)p;
    N = args->N * 5 > 100000 ? 100000 : args->N * 5;

    BENCH_VARS;
    COUNTER_START();
    TIMER_START();

    for (int i = 0; i < N; i++)
        SM3_once(msg, block, digest);

    COUNTER_STOP();
    TIMER_STOP();

    usec = USEC();
    avg_speed_MB = (N * block) / usec;
    avg_speed_Gb = 8 * avg_speed_MB / 1000;

    printf("average cycles per block : %ld \n", (int64_t)(TICKS() / (N * block / 64)));
    printf("block(B) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) \n");
    printf("   %ld     \t  %.4f  \t    %.4f   \t   %.4f \n\n", block, usec/1000, avg_speed_MB, avg_speed_Gb);
}